

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O3

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  byte bVar1;
  keeponval kVar2;
  ulong uVar3;
  long lVar4;
  Curl_handler *pCVar5;
  dynbuf *pdVar6;
  Curl_chunker *ch;
  _Bool *p_Var7;
  _Bool *p_Var8;
  _Bool _Var9;
  CURLcode CVar10;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  timediff_t tVar14;
  size_t size;
  char *pcVar15;
  size_t sVar16;
  char *auth;
  h1_tunnel_state_conflict *ts;
  bool bVar17;
  char byte;
  ssize_t nread;
  _Bool local_92;
  char local_91;
  httpreq *local_90;
  h1_tunnel_state_conflict *local_88;
  connectdata *local_80;
  size_t *local_78;
  dynbuf *local_70;
  undefined4 local_68;
  curl_socket_t local_64;
  connectdata **local_60;
  _Bool *local_58;
  dynbuf *local_50;
  Curl_chunker *local_48;
  curl_off_t *local_40;
  size_t local_38;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  ts = (h1_tunnel_state_conflict *)cf->ctx;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect");
  }
  CVar10 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *done = false;
  if (ts == (h1_tunnel_state_conflict *)0x0) {
    pCVar5 = cf->conn->handler;
    if ((pCVar5->flags & 0x4000) != 0) {
      Curl_failf(data,"%s cannot be done over CONNECT",pCVar5->scheme);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    CVar10 = Curl_get_upload_buffer(data);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    ts = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0x120);
    if (ts == (h1_tunnel_state_conflict *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"allocate connect buffer");
    }
    local_88 = (h1_tunnel_state_conflict *)&ts->rcvbuf;
    Curl_dyn_init((dynbuf *)local_88,0x4000);
    Curl_dyn_init(&ts->request_data,0x100000);
    Curl_httpchunk_init(data,&ts->ch,true);
    local_60 = &cf->conn;
    Curl_conncontrol(cf->conn,0);
    Curl_dyn_reset((dynbuf *)local_88);
    Curl_dyn_reset(&ts->request_data);
    ts->tunnel_state = H1_TUNNEL_INIT;
    ts->keepon = KEEPON_CONNECT;
    ts->cl = 0;
    ts->field_0x11c = ts->field_0x11c & 0xfd;
    cf->ctx = ts;
  }
  else {
    if (ts->tunnel_state == H1_TUNNEL_ESTABLISHED) goto LAB_0014e6e7;
    CVar10 = CURLE_RECV_ERROR;
    if (ts->tunnel_state == H1_TUNNEL_FAILED) goto LAB_0014e80a;
    local_60 = &cf->conn;
  }
  local_80 = cf->conn;
  local_50 = &ts->request_data;
  local_78 = &ts->nsent;
  local_70 = &ts->rcvbuf;
  local_40 = &ts->cl;
  local_48 = &ts->ch;
  local_88 = ts;
  do {
    tVar14 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar14 < 1) {
      Curl_failf(data,"Proxy CONNECT aborted due to timeout");
      CVar10 = CURLE_OPERATION_TIMEDOUT;
LAB_0014e7f5:
      h1_tunnel_go_state(cf,local_88,H1_TUNNEL_FAILED,data);
      goto LAB_0014e80a;
    }
    switch(ts->tunnel_state) {
    case H1_TUNNEL_INIT:
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT start");
      }
      local_90 = (httpreq *)0x0;
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      CVar10 = Curl_http_proxy_create_CONNECT(&local_90,cf,data,1);
      if (CVar10 == CURLE_OK) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s",local_90->authority);
        }
        pdVar6 = local_50;
        Curl_dyn_reset(local_50);
        *local_78 = 0;
        local_78[1] = 0;
        CVar10 = Curl_h1_req_write_head
                           (local_90,(uint)(((*local_60)->http_proxy).proxytype != '\x01'),pdVar6);
        if (CVar10 != CURLE_OK) goto LAB_0014dc96;
        CVar10 = CURLE_OK;
      }
      else {
LAB_0014dc96:
        Curl_failf(data,"Failed sending CONNECT to proxy");
      }
      if (local_90 != (httpreq *)0x0) {
        Curl_http_req_free(local_90);
      }
      if (CVar10 != CURLE_OK) goto LAB_0014e7f5;
      h1_tunnel_go_state(cf,local_88,H1_TUNNEL_CONNECT,data);
LAB_0014dcdc:
      if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT send");
      }
      break;
    case H1_TUNNEL_CONNECT:
      if (data != (Curl_easy *)0x0) goto LAB_0014dcdc;
      break;
    case H1_TUNNEL_RECEIVE:
      goto switchD_0014dbcc_caseD_2;
    case H1_TUNNEL_RESPONSE:
      goto switchD_0014dbcc_caseD_3;
    default:
      goto switchD_0014dbcc_default;
    }
    pdVar6 = local_50;
    pcVar15 = Curl_dyn_ptr(local_50);
    sVar16 = Curl_dyn_len(pdVar6);
    local_90 = (httpreq *)((ulong)local_90 & 0xffffffff00000000);
    uVar3 = *local_78;
    if (uVar3 <= sVar16 && sVar16 - uVar3 != 0) {
      size = (*cf->next->cft->do_send)
                       (cf->next,data,pcVar15 + uVar3,sVar16 - uVar3,(CURLcode *)&local_90);
      if ((long)size < 0) {
        if ((CURLcode)local_90 == 0x51) goto LAB_0014dd9d;
      }
      else {
        *local_78 = *local_78 + size;
        Curl_debug(data,CURLINFO_HEADER_OUT,pcVar15 + uVar3,size);
      }
      if ((CURLcode)local_90 != 0) {
        Curl_failf(data,"Failed sending CONNECT to proxy");
        if ((CURLcode)local_90 != CURLE_OK) {
          local_92 = false;
          CVar10 = (CURLcode)local_90;
          goto LAB_0014e7f5;
        }
      }
    }
LAB_0014dd9d:
    ts = local_88;
    if (*local_78 < sVar16) goto LAB_0014e6e7;
    h1_tunnel_go_state(cf,local_88,H1_TUNNEL_RECEIVE,data);
switchD_0014dbcc_caseD_2:
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"CONNECT receive");
    }
    local_64 = Curl_conn_cf_get_socket(cf,data);
    local_92 = false;
    _Var9 = Curl_conn_data_pending(data,cf->sockindex);
    CVar10 = CURLE_OK;
    if (_Var9) {
      kVar2 = ts->keepon;
      p_Var8 = done;
      p_Var7 = local_58;
      while (local_58 = p_Var8, kVar2 != KEEPON_DONE) {
        CVar10 = Curl_read(data,local_64,&local_91,1,(ssize_t *)&local_90);
        if (CVar10 == CURLE_AGAIN) {
          CVar10 = CURLE_OK;
          goto LAB_0014e419;
        }
        iVar11 = Curl_pgrsUpdate(data);
        ch = local_48;
        if (iVar11 != 0) {
          CVar10 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_0014e419;
        }
        if (CVar10 != CURLE_OK) {
          ts->keepon = KEEPON_DONE;
          local_92 = true;
          bVar17 = true;
          goto LAB_0014e41c;
        }
        if ((long)local_90 < 1) {
          if ((((data->set).proxyauth != 0) && ((data->state).authproxy.avail != 0)) &&
             ((data->state).aptr.proxyuserpwd != (char *)0x0)) {
            ts->field_0x11c = ts->field_0x11c | 2;
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"Proxy CONNECT connection closed");
            }
            goto LAB_0014e3c1;
          }
          Curl_failf(data,"Proxy CONNECT aborted");
          ts->keepon = KEEPON_DONE;
          local_92 = true;
          iVar11 = Curl_pgrsUpdate(data);
          CVar10 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar11 == 0) {
            CVar10 = CURLE_RECV_ERROR;
          }
          goto LAB_0014e7f5;
        }
        if (ts->keepon == KEEPON_IGNORE) {
          lVar4 = *local_40;
          if (lVar4 == 0) {
            if ((ts->field_0x11c & 1) == 0) goto LAB_0014e1cb;
            local_38 = 0;
            CVar10 = Curl_httpchunk_read(data,local_48,&local_91,1,&local_38);
            if (CVar10 != CURLE_OK) goto LAB_0014e419;
            _Var9 = Curl_httpchunk_is_done(data,ch);
            if (_Var9) {
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                Curl_infof(data,"chunk reading DONE");
              }
              ts->keepon = KEEPON_DONE;
            }
          }
          else {
            *local_40 = lVar4 + -1;
            if (lVar4 < 2) goto LAB_0014e3c1;
          }
        }
        else {
          CVar10 = Curl_dyn_addn(local_70,&local_91,1);
          pdVar6 = local_70;
          if (CVar10 != CURLE_OK) {
            Curl_failf(data,"CONNECT response too large");
            CVar10 = CURLE_RECV_ERROR;
            goto LAB_0014e419;
          }
          if (local_91 == '\n') {
            ts->headerlines = ts->headerlines + 1;
            pcVar15 = Curl_dyn_ptr(local_70);
            sVar16 = Curl_dyn_len(pdVar6);
            Curl_debug(data,CURLINFO_HEADER_IN,pcVar15,sVar16);
            CVar10 = Curl_client_write(data,(uint)(ts->headerlines == 1) * 8 + 0x14,pcVar15,sVar16);
            done = local_58;
            if ((CVar10 != CURLE_OK) ||
               (CVar10 = Curl_bump_headersize(data,sVar16,true), done = local_58, ts = local_88,
               CVar10 != CURLE_OK)) goto LAB_0014e419;
            if ((*pcVar15 == '\r') || (*pcVar15 == '\n')) {
              if (((data->req).httpcode != 0x197) || (((data->state).field_0x74c & 0x20) != 0)) {
LAB_0014e3c1:
                ts->keepon = KEEPON_DONE;
                p_Var7 = local_58;
                break;
              }
              local_88->keepon = KEEPON_IGNORE;
              if (local_88->cl == 0) {
                uVar13 = (uint)*(undefined8 *)&(data->set).field_0x8ba;
                if ((local_88->field_0x11c & 1) == 0) {
                  if (((uVar13 >> 0x1c & 1) != 0) && (0 < cf->cft->log_level)) {
                    Curl_trc_cf_infof(data,cf,"CONNECT: no content-length or chunked");
                  }
                  goto LAB_0014e3c1;
                }
                if ((uVar13 >> 0x1c & 1) != 0) {
                  Curl_infof(data,"Ignore chunked response-body");
                }
              }
              else if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Ignore %ld bytes of response-body");
              }
            }
            else {
              iVar11 = curl_strnequal(pcVar15,"WWW-Authenticate:",0x11);
              if ((iVar11 == 0) || ((data->req).httpcode != 0x191)) {
                iVar11 = curl_strnequal(pcVar15,"Proxy-authenticate:",0x13);
                if ((iVar11 != 0) &&
                   (uVar12 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar11 >> 8),1),
                   (data->req).httpcode == 0x197)) goto LAB_0014e0c4;
                iVar11 = curl_strnequal(pcVar15,"Content-Length:",0xf);
                if (iVar11 == 0) {
                  _Var9 = Curl_compareheader(pcVar15,"Connection:",0xb,"close",5);
                  if (_Var9) {
LAB_0014e19f:
                    ts->field_0x11c = ts->field_0x11c | 2;
                  }
                  else {
                    iVar11 = curl_strnequal(pcVar15,"Transfer-Encoding:",0x12);
                    if (iVar11 == 0) {
                      _Var9 = Curl_compareheader(pcVar15,"Proxy-Connection:",0x11,"close",5);
                      if (_Var9) goto LAB_0014e19f;
                      iVar11 = strncmp(pcVar15,"HTTP/1.",7);
                      if (((((iVar11 == 0) && ((pcVar15[7] & 0xfeU) == 0x30)) && (pcVar15[8] == ' ')
                           ) && (((byte)(pcVar15[9] - 0x30U) < 10 &&
                                 (bVar1 = pcVar15[10], (byte)(bVar1 - 0x30) < 10)))) &&
                         (((byte)(pcVar15[0xb] - 0x30U) < 10 && (9 < (byte)(pcVar15[0xc] - 0x30U))))
                         ) {
                        iVar11 = (uint)(byte)pcVar15[9] * 100 + ((uint)bVar1 + (uint)bVar1 * 4) * 2
                                 + (uint)(byte)pcVar15[0xb] + -0x14d0;
                        (data->req).httpcode = iVar11;
                        (data->info).httpproxycode = iVar11;
                      }
                    }
                    else if ((data->req).httpcode - 200U < 100) {
                      if (((data->set).field_0x8bd & 0x10) != 0) {
                        pcVar15 = "Ignoring Transfer-Encoding in CONNECT %03d response";
                        goto LAB_0014e171;
                      }
                    }
                    else {
                      _Var9 = Curl_compareheader(pcVar15,"Transfer-Encoding:",0x12,"chunked",7);
                      if (_Var9) {
                        if (((data->set).field_0x8bd & 0x10) != 0) {
                          Curl_infof(data,"CONNECT responded chunked");
                        }
                        ts->field_0x11c = ts->field_0x11c | 1;
                        Curl_httpchunk_reset(data,local_48,true);
                      }
                    }
                  }
                }
                else if ((data->req).httpcode - 200U < 100) {
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    pcVar15 = "Ignoring Content-Length in CONNECT %03d response";
LAB_0014e171:
                    Curl_infof(data,pcVar15);
                  }
                }
                else {
                  curlx_strtoofft(pcVar15 + 0xf,(char **)0x0,10,local_40);
                }
              }
              else {
                uVar12 = 0;
LAB_0014e0c4:
                local_68 = uVar12;
                auth = Curl_copy_header_value(pcVar15);
                if (auth == (char *)0x0) {
                  CVar10 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0014e419;
                }
                if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
                  Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",pcVar15);
                }
                CVar10 = Curl_http_input_auth(data,local_68._0_1_,auth);
                (*Curl_cfree)(auth);
                ts = local_88;
                if (CVar10 != CURLE_OK) goto LAB_0014e419;
              }
              Curl_dyn_reset(local_70);
            }
          }
        }
LAB_0014e1cb:
        p_Var8 = local_58;
        p_Var7 = local_58;
        kVar2 = ts->keepon;
      }
      local_58 = p_Var7;
      local_92 = true;
      bVar17 = true;
      if ((data->info).httpproxycode - 200U < 100) {
        CVar10 = CURLE_OK;
      }
      else {
        CVar10 = Curl_http_auth_act(data);
      }
    }
    else {
LAB_0014e419:
      bVar17 = false;
    }
LAB_0014e41c:
    iVar11 = Curl_pgrsUpdate(data);
    ts = local_88;
    if (iVar11 != 0) {
      CVar10 = CURLE_ABORTED_BY_CALLBACK;
      goto LAB_0014e7f5;
    }
    if (CVar10 != CURLE_OK) goto LAB_0014e7f5;
    if (!bVar17) goto LAB_0014e6e7;
    h1_tunnel_go_state(cf,local_88,H1_TUNNEL_RESPONSE,data);
switchD_0014dbcc_caseD_3:
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"CONNECT response");
    }
    if ((data->req).newurl == (char *)0x0) break;
    if (((ts->field_0x11c & 2) != 0) || (((uint)local_80->bits & 0x40) != 0)) {
      if ((((data->set).field_0x8bd & 0x10) != 0) &&
         ((cf->cft->log_level < 1 ||
          (Curl_trc_cf_infof(data,cf,"CONNECT need to close+open"),
          ((data->set).field_0x8bd & 0x10) != 0)))) {
        Curl_infof(data,"Connect me again please");
      }
      Curl_conn_cf_close(cf,data);
      Curl_conncontrol(local_80,0);
      CVar10 = Curl_conn_cf_connect(cf->next,data,false,&local_92);
      if (CVar10 != CURLE_OK) goto LAB_0014e7f5;
      goto LAB_0014e6e7;
    }
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_INIT,data);
switchD_0014dbcc_default:
  } while ((data->req).newurl != (char *)0x0);
  if (99 < (data->info).httpproxycode - 200U) {
    (*Curl_cfree)((void *)0x0);
    (data->req).newurl = (char *)0x0;
    Curl_conncontrol(local_80,2);
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_FAILED,data);
    Curl_failf(data,"CONNECT tunnel failed, response %d",(ulong)(uint)(data->req).httpcode);
    CVar10 = CURLE_RECV_ERROR;
LAB_0014e80a:
    *done = false;
    return CVar10;
  }
  h1_tunnel_go_state(cf,ts,H1_TUNNEL_ESTABLISHED,data);
  if (((data->set).field_0x8bd & 0x10) != 0) {
    Curl_infof(data,"CONNECT tunnel established, response %d",
               (ulong)(uint)(data->info).httpproxycode);
  }
LAB_0014e6e7:
  (*Curl_cfree)((data->state).aptr.proxyuserpwd);
  (data->state).aptr.proxyuserpwd = (char *)0x0;
  if (cf->ctx == (void *)0x0) {
    *done = false;
    return CURLE_OK;
  }
  bVar17 = *(int *)((long)cf->ctx + 0x118) == 4;
  *done = bVar17;
  if (!bVar17) {
    return CURLE_OK;
  }
  cf->field_0x24 = cf->field_0x24 | 1;
  (data->req).bytecount = 0;
  *(ushort *)&(data->req).field_0xbb = (*(ushort *)&(data->req).field_0xbb & 0xffde) + 1;
  Curl_client_cleanup(data);
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  tunnel_free(cf,data);
  return CURLE_OK;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* TODO: can we do blocking? */
  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* Restore `data->req` fields that may habe been touched */
    data->req.header = TRUE; /* assume header */
    data->req.bytecount = 0;
    data->req.ignorebody = FALSE;
    Curl_client_cleanup(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}